

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O2

int DSA_size(DSA *param_1)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  iVar3 = 0;
  if ((BIGNUM *)param_1->version != (BIGNUM *)0x0) {
    uVar1 = BN_num_bytes((BIGNUM *)param_1->version);
    uVar4 = (ulong)uVar1;
    sVar2 = der_len_len(uVar4 + 1);
    lVar5 = sVar2 + 2 + uVar4;
    if (-1 < lVar5 && !CARRY8(sVar2 + 2,uVar4)) {
      sVar2 = der_len_len(lVar5 * 2);
      uVar4 = sVar2 + lVar5 * 2 + 1;
      iVar3 = (int)uVar4;
      if (uVar4 < (ulong)(lVar5 * 2)) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int DSA_size(const DSA *dsa) {
  if (dsa->q == NULL) {
    return 0;
  }

  size_t order_len = BN_num_bytes(dsa->q);
  // Compute the maximum length of an |order_len| byte integer. Defensively
  // assume that the leading 0x00 is included.
  size_t integer_len = 1 /* tag */ + der_len_len(order_len + 1) + 1 + order_len;
  if (integer_len < order_len) {
    return 0;
  }
  // A DSA signature is two INTEGERs.
  size_t value_len = 2 * integer_len;
  if (value_len < integer_len) {
    return 0;
  }
  // Add the header.
  size_t ret = 1 /* tag */ + der_len_len(value_len) + value_len;
  if (ret < value_len) {
    return 0;
  }
  return ret;
}